

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bloom.cpp
# Opt level: O0

bool __thiscall
CRollingBloomFilter::contains(CRollingBloomFilter *this,Span<const_unsigned_char> vKey)

{
  long lVar1;
  Span<const_unsigned_char> vDataToHash;
  uint32_t uVar2;
  const_reference pvVar3;
  long in_RDI;
  long in_FS_OFFSET;
  uint32_t pos;
  int bit;
  uint32_t h;
  int n;
  uint32_t in_stack_ffffffffffffff98;
  uint in_stack_ffffffffffffff9c;
  undefined4 in_stack_ffffffffffffffa0;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *in_stack_ffffffffffffffa8;
  uint32_t in_stack_ffffffffffffffb8;
  uint in_stack_ffffffffffffffbc;
  undefined4 local_3c;
  undefined1 local_29;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  local_3c = 0;
  do {
    if (*(int *)(in_RDI + 0x2c) <= local_3c) {
      local_29 = true;
LAB_008113e0:
      if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
        return local_29;
      }
      __stack_chk_fail();
    }
    vDataToHash.m_size._0_4_ = in_stack_ffffffffffffffb8;
    vDataToHash.m_data = (uchar *)in_RDI;
    vDataToHash.m_size._4_4_ = in_stack_ffffffffffffffbc;
    uVar2 = RollingBloomHash(in_stack_ffffffffffffff9c,in_stack_ffffffffffffff98,vDataToHash);
    in_stack_ffffffffffffffbc = uVar2 & 0x3f;
    std::vector<unsigned_long,_std::allocator<unsigned_long>_>::size
              ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
               CONCAT44(in_stack_ffffffffffffff9c,in_stack_ffffffffffffff98));
    in_stack_ffffffffffffffb8 = FastRange32(in_stack_ffffffffffffff9c,in_stack_ffffffffffffff98);
    pvVar3 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                       (in_stack_ffffffffffffffa8,CONCAT44(uVar2,in_stack_ffffffffffffffa0));
    in_stack_ffffffffffffffa8 = (vector<unsigned_long,_std::allocator<unsigned_long>_> *)*pvVar3;
    pvVar3 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                       (in_stack_ffffffffffffffa8,CONCAT44(uVar2,in_stack_ffffffffffffffa0));
    if ((((ulong)in_stack_ffffffffffffffa8 | *pvVar3) >> ((byte)in_stack_ffffffffffffffbc & 0x3f) &
        1) == 0) {
      local_29 = false;
      goto LAB_008113e0;
    }
    local_3c = local_3c + 1;
  } while( true );
}

Assistant:

bool CRollingBloomFilter::contains(Span<const unsigned char> vKey) const
{
    for (int n = 0; n < nHashFuncs; n++) {
        uint32_t h = RollingBloomHash(n, nTweak, vKey);
        int bit = h & 0x3F;
        uint32_t pos = FastRange32(h, data.size());
        /* If the relevant bit is not set in either data[pos & ~1] or data[pos | 1], the filter does not contain vKey */
        if (!(((data[pos & ~1U] | data[pos | 1]) >> bit) & 1)) {
            return false;
        }
    }
    return true;
}